

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_3::initializeImage
               (Context *ctx,VkImage im,ConstPixelBufferAccess *pba,ImageViewParameters *imParams)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint64 dVar7;
  VkCommandBuffer_s *pVVar8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  void *dst;
  deUint32 queueFamilyIndex;
  int iVar9;
  VkResult VVar10;
  int iVar11;
  DeviceInterface *vk;
  VkDevice device;
  TextureFormat TVar12;
  int *piVar13;
  Handle<(vk::HandleType)8> *pHVar14;
  MovePtr *this;
  Allocation *pAVar15;
  VkDeviceSize VVar16;
  Handle<(vk::HandleType)24> *pHVar17;
  void *pvVar18;
  IVec3 *pIVar19;
  size_t numBytes;
  void *src;
  VkDeviceMemory memory;
  deUint32 *pdVar20;
  VkCommandBuffer_s **ppVVar21;
  size_type sVar22;
  reference pvVar23;
  VkQueue pVVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Handle<(vk::HandleType)6> local_3e0;
  undefined8 uStack_3d8;
  VkSubmitInfo copySubmitInfo;
  undefined4 local_380 [2];
  VkBufferMemoryBarrier bufMemBar;
  VkImageMemoryBarrier imMemBar;
  VkImageSubresourceRange imMemBarSubRange;
  VkCommandBufferBeginInfo beginInfo;
  undefined1 local_2c0 [8];
  VkBufferImageCopy curRegion;
  VkImageSubresourceLayers curSubresource;
  size_t copySize;
  IVec3 curLevelSize;
  int level;
  deUint8 *bufCurPtr;
  deUint8 *bufMapPtr;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  Move<vk::VkCommandBuffer_s_*> local_220;
  RefData<vk::VkCommandBuffer_s_*> local_200;
  undefined1 local_1e0 [8];
  Unique<vk::VkCommandBuffer_s_*> copyBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1a0;
  undefined1 local_180 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> copyPool;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_148;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_138;
  undefined1 local_128 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufMem;
  undefined1 local_110 [8];
  VkMemoryRequirements bufMemReq;
  Move<vk::Handle<(vk::HandleType)8>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> buf;
  VkBufferCreateInfo bufCreateInfo;
  VkDeviceSize bufSize;
  deUint32 uqfi;
  VkDevice dev;
  DeviceInterface *vkd;
  ImageViewParameters *imParams_local;
  ConstPixelBufferAccess *pba_local;
  Context *ctx_local;
  VkImage im_local;
  
  vk = Context::getDeviceInterface(ctx);
  device = Context::getDevice(ctx);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(ctx);
  TVar12 = ::vk::mapVkFormat(imParams->format);
  iVar9 = tcu::getPixelSize(TVar12);
  iVar1 = imParams->arrayLayers;
  pIVar19 = &imParams->size;
  piVar13 = tcu::Vector<int,_3>::operator[](pIVar19,0);
  iVar2 = *piVar13;
  piVar13 = tcu::Vector<int,_3>::operator[](pIVar19,1);
  iVar3 = *piVar13;
  piVar13 = tcu::Vector<int,_3>::operator[](pIVar19,2);
  iVar4 = *piVar13;
  buf.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0xc;
  ::vk::createBuffer(&local_e8,vk,device,
                     (VkBufferCreateInfo *)
                     &buf.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  uVar25 = SUB84(local_c8.deleter.m_deviceIface,0);
  uVar26 = (undefined4)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar25;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar26;
  data_00.deleter.m_device = local_c8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_e8);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  bufMem.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
       pHVar14->m_internal;
  (*vk->_vptr_DeviceInterface[0xe])
            (vk,device,
             bufMem.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
             _8_8_,local_110);
  this = (MovePtr *)Context::getDefaultAllocator(ctx);
  (*(*(_func_int ***)this)[3])
            (&local_148,this,local_110,(ulong)::vk::MemoryRequirement::HostVisible);
  local_138 = de::details::MovePtr::operator_cast_to_PtrData(&local_148,this);
  data._8_4_ = uVar25;
  data.ptr = (Allocation *)local_c8.object.m_internal;
  data._12_4_ = uVar26;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_148);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  dVar7 = pHVar14->m_internal;
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128)
  ;
  copyPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar15);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128)
  ;
  VVar16 = ::vk::Allocation::getOffset(pAVar15);
  VVar10 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,dVar7,
                      copyPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator,VVar16);
  ::vk::checkResult(VVar10,
                    "vkd.bindBufferMemory(dev, buf.get(), bufMem->getMemory(), bufMem->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
                    ,0x167);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk,device,1,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1a0,
             (Move *)&copyBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1a0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1a0.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_1a0.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_180,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_180);
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar17->m_internal;
  ::vk::allocateCommandBuffer
            (&local_220,vk,device,
             (VkCommandPool)
             copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_200,(Move *)&local_220);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_200.deleter.m_deviceIface;
  data_02.object = local_200.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_200.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_200.deleter.m_device;
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_200.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_200.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1e0,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_220);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&bufMapPtr);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128)
  ;
  pvVar18 = ::vk::Allocation::getHostPtr(pAVar15);
  unique0x100010ae = pvVar18;
  for (curLevelSize.m_data[1] = 0; curLevelSize.m_data[1] < imParams->levels;
      curLevelSize.m_data[1] = curLevelSize.m_data[1] + 1) {
    pIVar19 = tcu::ConstPixelBufferAccess::getSize(pba + curLevelSize.m_data[1]);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&copySize,pIVar19);
    TVar12 = ::vk::mapVkFormat(imParams->format);
    iVar11 = tcu::getPixelSize(TVar12);
    piVar13 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,0);
    iVar5 = *piVar13;
    piVar13 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,1);
    iVar6 = *piVar13;
    piVar13 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,2);
    dst = stack0xfffffffffffffdb0;
    numBytes = (size_t)(iVar11 * iVar5 * iVar6 * *piVar13 * imParams->arrayLayers);
    src = tcu::ConstPixelBufferAccess::getDataPtr(pba + curLevelSize.m_data[1]);
    ::deMemcpy(dst,src,numBytes);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_128);
    memory = ::vk::Allocation::getMemory(pAVar15);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_128);
    VVar16 = ::vk::Allocation::getOffset(pAVar15);
    ::vk::flushMappedMemoryRange
              (vk,device,memory,(long)stack0xfffffffffffffdb0 + (VVar16 - (long)pvVar18),numBytes);
    curRegion.imageExtent.height = 1;
    curRegion.imageExtent.depth = curLevelSize.m_data[1];
    local_2c0 = (undefined1  [8])((long)stack0xfffffffffffffdb0 - (long)pvVar18);
    curRegion.bufferOffset._0_4_ = 0;
    curRegion.bufferOffset._4_4_ = 0;
    curRegion.bufferImageHeight = curLevelSize.m_data[1];
    curRegion.bufferRowLength = 1;
    curRegion.imageSubresource._0_8_ = (ulong)(uint)imParams->arrayLayers << 0x20;
    curRegion.imageSubresource.baseArrayLayer = 0;
    curRegion.imageSubresource.layerCount = 0;
    curRegion.imageOffset.x = 0;
    piVar13 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,0);
    curRegion.imageOffset.y = *piVar13;
    piVar13 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,1);
    curRegion.imageOffset.z = *piVar13;
    pdVar20 = (deUint32 *)tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&copySize,2);
    curRegion.imageExtent.width = *pdVar20;
    std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
              ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&bufMapPtr,
               (value_type *)local_2c0);
    register0x00000000 = (void *)(numBytes + (long)stack0xfffffffffffffdb0);
  }
  imMemBarSubRange.baseArrayLayer = 0x2a;
  imMemBarSubRange.layerCount = 0;
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  VVar10 = (*vk->_vptr_DeviceInterface[0x49])(vk,*ppVVar21,&imMemBarSubRange.baseArrayLayer);
  ::vk::checkResult(VVar10,"vkd.beginCommandBuffer(copyBuffer.get(), &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
                    ,0x19e);
  imMemBarSubRange.aspectMask = imParams->levels;
  imMemBarSubRange.baseMipLevel = 0;
  imMemBarSubRange.levelCount = imParams->arrayLayers;
  bufMemBar.size._0_4_ = 0x2d;
  local_380[0] = 0x2c;
  bufMemBar.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufMemBar._4_4_ = 0;
  bufMemBar.pNext._0_4_ = 0x4000;
  bufMemBar.pNext._4_4_ = 0x800;
  bufMemBar.srcAccessMask = 0xffffffff;
  bufMemBar.dstAccessMask = 0xffffffff;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  bufMemBar._24_8_ = pHVar14->m_internal;
  bufMemBar.buffer.m_internal = 0;
  bufMemBar.offset = (long)(iVar9 * iVar1 * iVar2 * iVar3 * iVar4 * 2);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,*ppVVar21,0x10000,0x10000,0,0,0,1,local_380,1,&bufMemBar.size);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  pVVar8 = *ppVVar21;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  dVar7 = pHVar14->m_internal;
  copySubmitInfo.pSignalSemaphores = (VkSemaphore *)im.m_internal;
  sVar22 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                     ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                      &bufMapPtr);
  pvVar23 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::operator[]
                      ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                       &bufMapPtr,0);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,pVVar8,dVar7,copySubmitInfo.pSignalSemaphores,7,sVar22 & 0xffffffff,pvVar23);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar21,0x10000,0x10000,0,0,0,0,0,1,&bufMemBar.size);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  VVar10 = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppVVar21);
  ::vk::checkResult(VVar10,"vkd.endCommandBuffer(copyBuffer.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
                    ,0x1e6);
  copySubmitInfo.commandBufferCount = 0;
  copySubmitInfo._44_4_ = 0;
  copySubmitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  copySubmitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  copySubmitInfo.pNext = (void *)0x0;
  copySubmitInfo.waitSemaphoreCount = 0;
  copySubmitInfo._20_4_ = 0;
  copySubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copySubmitInfo._4_4_ = 0;
  copySubmitInfo.signalSemaphoreCount = 0;
  copySubmitInfo._60_4_ = 0;
  uStack_3d8 = 4;
  copySubmitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  copySubmitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  pVVar24 = Context::getUniversalQueue(ctx);
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_3e0,0);
  VVar10 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar24,1,&uStack_3d8,local_3e0.m_internal);
  ::vk::checkResult(VVar10,"vkd.queueSubmit(ctx.getUniversalQueue(), 1, &copySubmitInfo, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
                    ,0x1f5);
  pVVar24 = Context::getUniversalQueue(ctx);
  VVar10 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar24);
  ::vk::checkResult(VVar10,"vkd.queueWaitIdle(ctx.getUniversalQueue())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringExplicitLodTests.cpp"
                    ,0x1f6);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&bufMapPtr);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_180);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  return;
}

Assistant:

void initializeImage(Context& ctx, VkImage im, const ConstPixelBufferAccess* pba, ImageViewParameters imParams)
{
	const DeviceInterface& vkd = ctx.getDeviceInterface();
	const VkDevice dev = ctx.getDevice();
	const deUint32 uqfi = ctx.getUniversalQueueFamilyIndex();

	const VkDeviceSize bufSize =
		getPixelSize(mapVkFormat(imParams.format))
		* imParams.arrayLayers
		* imParams.size[0]
		* imParams.size[1]
		* imParams.size[2]
		* 2;

    const VkBufferCreateInfo bufCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0,										// flags
		bufSize,								// size
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		1,										// queueFamilyIndexCount
		&uqfi									// pQueueFamilyIndices
	};

	Unique<VkBuffer> buf(createBuffer(vkd, dev, &bufCreateInfo));

	VkMemoryRequirements bufMemReq;
	vkd.getBufferMemoryRequirements(dev, buf.get(), &bufMemReq);

	de::UniquePtr<Allocation> bufMem(ctx.getDefaultAllocator().allocate(bufMemReq, MemoryRequirement::HostVisible));
	VK_CHECK(vkd.bindBufferMemory(dev, buf.get(), bufMem->getMemory(), bufMem->getOffset()));

	Unique<VkCommandPool> copyPool(createCommandPool(vkd, dev, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, uqfi));

	Unique<VkCommandBuffer> copyBuffer(allocateCommandBuffer(vkd, dev, *copyPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	std::vector<VkBufferImageCopy> copyRegions;

	deUint8* const bufMapPtr = reinterpret_cast<deUint8*>(bufMem->getHostPtr());
	deUint8* bufCurPtr = bufMapPtr;

	for (int level = 0; level < imParams.levels; ++level)
	{
		const IVec3 curLevelSize = pba[level].getSize();

		const std::size_t copySize =
			getPixelSize(mapVkFormat(imParams.format))
			* curLevelSize[0] * curLevelSize[1] * curLevelSize[2]
			* imParams.arrayLayers;

		deMemcpy(bufCurPtr, pba[level].getDataPtr(), copySize);

	    flushMappedMemoryRange(vkd, dev, bufMem->getMemory(), bufMem->getOffset() + (bufCurPtr - bufMapPtr), copySize);

		const VkImageSubresourceLayers curSubresource =
		{
			VK_IMAGE_ASPECT_COLOR_BIT,
			(deUint32)level,
			0,
			(deUint32)imParams.arrayLayers
		};

		const VkBufferImageCopy curRegion =
		{
			(VkDeviceSize) (bufCurPtr - bufMapPtr),
			0,
			0,
			curSubresource,
			{0U, 0U, 0U},
			{(deUint32)curLevelSize[0], (deUint32)curLevelSize[1], (deUint32)curLevelSize[2]}
		};

		copyRegions.push_back(curRegion);

		bufCurPtr += copySize;
	}

	const VkCommandBufferBeginInfo beginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,
		DE_NULL
	};

	VK_CHECK(vkd.beginCommandBuffer(copyBuffer.get(), &beginInfo));

	const VkImageSubresourceRange imMemBarSubRange =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,
		0,
		(deUint32)imParams.levels,
		0,
		(deUint32)imParams.arrayLayers
	};

	VkImageMemoryBarrier imMemBar =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		0,
		VK_ACCESS_TRANSFER_WRITE_BIT,
		VK_IMAGE_LAYOUT_UNDEFINED,
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		im,
		imMemBarSubRange
	};

	VkBufferMemoryBarrier bufMemBar =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,
		VK_ACCESS_HOST_WRITE_BIT,
		VK_ACCESS_TRANSFER_READ_BIT,
		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		buf.get(),
		0,
		bufSize
	};

	vkd.cmdPipelineBarrier(copyBuffer.get(),
						   VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,
						   VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,
						   0,
						   0,
						   DE_NULL,
						   1,
						   &bufMemBar,
						   1,
						   &imMemBar);

	vkd.cmdCopyBufferToImage(copyBuffer.get(),
							 buf.get(),
							 im,
							 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
							 (deUint32)copyRegions.size(),
							 &copyRegions[0]);

	imMemBar.srcAccessMask = VK_ACCESS_TRANSFER_WRITE_BIT;
	imMemBar.dstAccessMask = VK_ACCESS_SHADER_READ_BIT;
	imMemBar.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
	imMemBar.newLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;

	vkd.cmdPipelineBarrier(copyBuffer.get(),
						   VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,
						   VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,
						   0,
						   0,
						   DE_NULL,
						   0,
						   DE_NULL,
						   1,
						   &imMemBar);

	VK_CHECK(vkd.endCommandBuffer(copyBuffer.get()));

	const VkSubmitInfo copySubmitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0,
		DE_NULL,
		DE_NULL,
		1,
		&(copyBuffer.get()),
		0,
		DE_NULL
	};

	VK_CHECK(vkd.queueSubmit(ctx.getUniversalQueue(), 1, &copySubmitInfo, 0));
	VK_CHECK(vkd.queueWaitIdle(ctx.getUniversalQueue()));
}